

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createTexture_checker(SemanticParser *this,SP *in)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *result;
  float fVar5;
  SP SVar6;
  SP tex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::CheckerTexture>();
  lVar1 = *in_RDX;
  p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
  do {
    _Var2._M_pi = tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var4 == (_Rb_tree_node_base *)(lVar1 + 0x10)) {
      tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var4 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar3 = std::operator==(&name,"uscale");
    if (bVar3) {
      fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)(*in_RDX + 8),&name,0.0);
      (tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->uScale =
           fVar5;
    }
    else {
      bVar3 = std::operator==(&name,"vscale");
      if (bVar3) {
        fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)(*in_RDX + 8),&name,0.0);
        (tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vScale =
             fVar5;
      }
      else {
        bVar3 = std::operator==(&name,"tex1");
        if (bVar3) {
          result = &(tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->tex1;
        }
        else {
          bVar3 = std::operator==(&name,"tex2");
          if (!bVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_c0,"unknown checker texture param \'",&name);
            std::operator+(&local_a0,&local_c0,"\'");
            std::runtime_error::runtime_error(this_00,(string *)&local_a0);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          result = &(tex.super___shared_ptr<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->tex2;
        }
        syntactic::ParamSet::getParam3f((ParamSet *)(*in_RDX + 8),&result->x,&name);
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

Texture::SP SemanticParser::createTexture_checker(pbrt::syntactic::Texture::SP in)
  {
    CheckerTexture::SP tex = std::make_shared<CheckerTexture>();
    for (auto it : in->param) {
      const std::string name = it.first;
      if (name == "uscale") {
        tex->uScale = in->getParam1f(name);
        continue;
      }
      if (name == "vscale") {
        tex->vScale = in->getParam1f(name);
        continue;
      }
      if (name == "tex1") {
        in->getParam3f(&tex->tex1.x,name);
        continue;
      }
      if (name == "tex2") {
        in->getParam3f(&tex->tex2.x,name);
        continue;
      }
      throw std::runtime_error("unknown checker texture param '"+name+"'");
    }
    return tex;
  }